

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void expression(item *x)

{
  int op;
  item *x_00;
  
  x_00 = (item *)calloc(1,0x30);
  simpleExpression(x);
  op = currentSymbol;
  if (5 < currentSymbol - 0x66U) {
    return;
  }
  getSymbol();
  if (currentSymbol == 0x26a) {
    getSymbol();
    if ((op != 0x69) && (op != 0x66)) {
      mark("NULL in incompatible relation");
      exit(-1);
    }
    nullRelation(op,x);
    return;
  }
  simpleExpression(x_00);
  relation(op,x,x_00);
  return;
}

Assistant:

procedure 
void expression(struct item *x) {
	variable int op;
	variable struct item *y;
	y = NULL; op=0;
	allocMem(y);
	simpleExpression(x);
	if ((currentSymbol == SYMBOL_LESS) || (currentSymbol == SYMBOL_GREATER) ||
		(currentSymbol == SYMBOL_NOT)  || (currentSymbol == SYMBOL_GEQ) ||
		(currentSymbol == SYMBOL_LEQ)  || (currentSymbol == SYMBOL_EQUALTEST)) {
		op = currentSymbol;
		getSymbol();
		if (currentSymbol == SYMBOL_NULL) { /* handle null relation */
			getSymbol();
			if ((op == SYMBOL_EQUALTEST) || (op == SYMBOL_NOT)) {
				nullRelation(op,x);
			} else {
				mark("NULL in incompatible relation");
				exit(-1);
			}
		} else {
			simpleExpression(y);
			relation(op,x,y);
		}
	}
}